

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

iterator anon_unknown.dwarf_dd40c::findByNameOrAlias<VulkanHppGenerator::CommandData>
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
                    *values,string *name)

{
  _Rb_tree_header *p_Var1;
  __type_conflict _Var2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
          ::find(&values->_M_t,name);
  p_Var1 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  iVar5 = iVar4;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    for (iVar5._M_node = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar5._M_node != iVar4._M_node;
        iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar5._M_node + 1),name);
      if (_Var2) break;
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::contains((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)(iVar5._M_node + 2),name);
      if (bVar3) break;
    }
  }
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    return (iterator)iVar5._M_node;
  }
  __assert_fail("it != values.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x424e,
                "typename std::map<std::string, T>::iterator (anonymous namespace)::findByNameOrAlias(std::map<std::string, T> &, const std::string &) [T = VulkanHppGenerator::CommandData]"
               );
}

Assistant:

typename std::map<std::string, T>::iterator findByNameOrAlias( std::map<std::string, T> & values, std::string const & name )
  {
    auto it = values.find( name );
    if ( it == values.end() )
    {
      it = std::ranges::find_if( values, [&name]( auto const & value ) { return ( value.first == name ) || value.second.aliases.contains( name ); } );
    }
    assert( it != values.end() );
    return it;
  }